

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void printWordVectors(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  istream *v;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  Vector vec;
  string word;
  FastText fasttext;
  string *in_stack_00000158;
  FastText *in_stack_00000160;
  undefined4 in_stack_fffffffffffffef0;
  Vector *in_stack_ffffffffffffff00;
  FastText *in_stack_ffffffffffffff10;
  string local_e8 [8];
  string *in_stack_ffffffffffffff20;
  Vector *in_stack_ffffffffffffff28;
  FastText *in_stack_ffffffffffffff30;
  string local_b8 [184];
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar3 != 3) {
    printPrintWordVectorsUsage();
    exit(1);
  }
  ::fasttext::FastText::FastText(in_stack_ffffffffffffff10);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,2);
  std::__cxx11::string::string(local_b8,(string *)pvVar4);
  ::fasttext::FastText::loadModel(in_stack_00000160,in_stack_00000158);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::string(local_e8);
  iVar2 = ::fasttext::FastText::getDimension((FastText *)0x140a07);
  ::fasttext::Vector::Vector(in_stack_ffffffffffffff00,(int64_t)in_RDI);
  while( true ) {
    v = std::operator>>((istream *)&std::cin,local_e8);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(v + *(long *)(*(long *)v + -0x18)));
    if (!bVar1) break;
    ::fasttext::FastText::getWordVector
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    poVar5 = std::operator<<((ostream *)&std::cout,local_e8);
    std::operator<<(poVar5," ");
    poVar5 = ::fasttext::operator<<
                       ((ostream *)CONCAT44(iVar2,in_stack_fffffffffffffef0),(Vector *)v);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  exit(0);
}

Assistant:

void printWordVectors(const std::vector<std::string> args) {
  if (args.size() != 3) {
    printPrintWordVectorsUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));
  std::string word;
  Vector vec(fasttext.getDimension());
  while (std::cin >> word) {
    fasttext.getWordVector(vec, word);
    std::cout << word << " " << vec << std::endl;
  }
  exit(0);
}